

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_cm.c
# Opt level: O2

int isobusfs_srv_request_volume
              (isobusfs_srv_priv *priv,isobusfs_srv_client *client,isobusfs_srv_volume *volume)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 3;
  while (lVar1 != 0xf0) {
    lVar2 = lVar1 + -3;
    lVar1 = lVar1 + 1;
    if (volume->clients[lVar2] == client) {
      return 0;
    }
  }
  lVar1 = 3;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0xf0) {
      return -2;
    }
    lVar1 = lVar2 + 1;
  } while (volume->clients[lVar2 + -3] != (isobusfs_srv_client *)0x0);
  volume->clients[lVar2 + -3] = client;
  volume->refcount = volume->refcount + 1;
  return 0;
}

Assistant:

int isobusfs_srv_request_volume(struct isobusfs_srv_priv *priv,
				struct isobusfs_srv_client *client,
				struct isobusfs_srv_volume *volume)
{
	unsigned int j;

	/* Check if the client already requested this volume */
	for (j = 0; j < ARRAY_SIZE(volume->clients); j++) {
		if (volume->clients[j] == client) {
			/* Client already requested this volume, do not
			 * increase refcount 
			 */
			return 0;
		}
	}

	/* Add client to the volume's client list and increase refcount */
	for (j = 0; j < ARRAY_SIZE(volume->clients); j++) {
		if (volume->clients[j] == NULL) {
			volume->clients[j] = client;
			volume->refcount++;
			return 0;
		}
	}

	return -ENOENT;
}